

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O2

Output_GetVersion __thiscall ViconDataStreamSDK::CPP::Client::GetVersion(Client *this)

{
  Output_GetVersion Output;
  Output_GetVersion local_18;
  
  Core::VClient::GetVersion
            ((this->m_pClientImpl->m_pCoreClient).
             super___shared_ptr<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&local_18.Major,&local_18.Minor,&local_18.Point,&local_18.Revision);
  return local_18;
}

Assistant:

CLASS_DECLSPEC
  Output_GetVersion Client::GetVersion() const
  {
    Output_GetVersion Output;
    m_pClientImpl->m_pCoreClient->GetVersion( Output.Major, 
                                              Output.Minor, 
                                              Output.Point,
                                              Output.Revision );

    return Output;
  }